

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall fasttext::Loss::predict(Loss *this,Predictions *predictions,State *state)

{
  pointer pfVar1;
  undefined8 in_RAX;
  pointer pfVar2;
  long lVar3;
  double dVar4;
  undefined8 local_28;
  
  local_28._4_4_ = (float)((ulong)in_RAX >> 0x20);
  (*this->_vptr_Loss[3])(this,state);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
            (predictions,
             (long)(state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_28 = (ulong)(uint)local_28._4_4_ << 0x20;
  pfVar2 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar1 != pfVar2 && -1 < (long)pfVar1 - (long)pfVar2) {
    lVar3 = 0;
    do {
      dVar4 = ::log((double)pfVar2[lVar3] + 1e-05);
      local_28._4_4_ = (float)dVar4;
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<float,int&>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)predictions,
                 (float *)((long)&local_28 + 4),(int *)&local_28);
      lVar3 = (long)(int)local_28 + 1;
      local_28 = CONCAT44(local_28._4_4_,(int)lVar3);
      pfVar2 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar3 < (long)(state->output).data_.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pfVar2 >> 2);
  }
  return;
}

Assistant:

void Loss::predict(Predictions& predictions, Model::State& state) const {
  computeOutput(state);
  const Vector& output = state.output;
  predictions.reserve(output.size());
  for (int32_t i = 0; i < output.size(); i++) {
    predictions.emplace_back(std_log(output[i]), i);
  }
}